

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

void __thiscall
libebml::EbmlMaster::Read
          (EbmlMaster *this,EbmlStream *inDataStream,EbmlSemanticContext *sContext,
          int *UpperEltFound,EbmlElement **FoundElt,bool AllowDummyElt,ScopeMode ReadFully)

{
  pointer ppEVar1;
  pointer ppEVar2;
  EbmlElement *pEVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  uint64 uVar7;
  bool bVar8;
  undefined3 uVar9;
  int iVar10;
  undefined4 extraout_var;
  uint64 uVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte bVar12;
  undefined7 in_register_00000089;
  uint64 uVar13;
  const_iterator __position;
  ulong uVar14;
  EbmlElement *local_60;
  uint local_58;
  uint local_54;
  EbmlElement **local_50;
  vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_> *local_48;
  EbmlSemanticContext *local_40;
  EbmlStream *local_38;
  
  local_54 = (uint)CONCAT71(in_register_00000089,AllowDummyElt);
  if (ReadFully == SCOPE_NO_DATA) {
    return;
  }
  local_48 = &this->ElementList;
  uVar14 = 0;
  local_50 = FoundElt;
  local_40 = sContext;
  while( true ) {
    ppEVar1 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppEVar2 - (long)ppEVar1 >> 3) <= uVar14) break;
    if (ppEVar1[uVar14]->bLocked == false) {
      (*ppEVar1[uVar14]->_vptr_EbmlElement[1])();
    }
    uVar14 = uVar14 + 1;
  }
  if (ppEVar2 != ppEVar1) {
    (this->ElementList).
    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar1;
  }
  uVar13 = 0x7fffffff;
  if ((this->super_EbmlElement).bSizeIsFinite == true) {
    iVar10 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    uVar13 = CONCAT44(extraout_var,iVar10);
    if (uVar13 == 0) goto LAB_0019237c;
  }
  (*inDataStream->Stream->_vptr_IOCallback[3])
            (inDataStream->Stream,
             (long)(this->super_EbmlElement).SizeLength + (this->super_EbmlElement).SizePosition,0);
  local_58 = local_54 & 0xff;
  local_60 = EbmlStream::FindNextElement
                       (inDataStream,local_40,UpperEltFound,uVar13,(bool)(char)local_54,1);
  local_38 = inDataStream;
  while (local_60 != (EbmlElement *)0x0) {
    if (0 < *UpperEltFound) goto LAB_00192374;
    if (((this->super_EbmlElement).bSizeIsFinite == true) && (local_60->bSizeIsFinite == true)) {
      uVar13 = EbmlElement::GetEndPosition(&this->super_EbmlElement);
      uVar11 = EbmlElement::GetEndPosition(local_60);
      uVar13 = uVar13 - uVar11;
    }
    if (((char)local_54 != '\0') ||
       (iVar10 = (*local_60->_vptr_EbmlElement[0xd])(local_60), (char)iVar10 == '\0')) {
      pEVar3 = local_60;
      iVar10 = (*local_60->_vptr_EbmlElement[4])(local_60);
      inDataStream = local_38;
      (*pEVar3->_vptr_EbmlElement[0xb])
                (pEVar3,local_38,*(undefined8 *)(CONCAT44(extraout_var_00,iVar10) + 0x18),
                 UpperEltFound,local_50,(ulong)local_58,ReadFully);
      bVar12 = ReadFully != SCOPE_ALL_DATA | local_60->bValueIsSet;
      if (bVar12 == 1) {
        std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::push_back
                  (local_48,&local_60);
        if (local_60->bSizeIsFinite != false) {
LAB_00192294:
          pEVar3 = local_60;
          iVar10 = (*local_60->_vptr_EbmlElement[4])(local_60);
          EbmlElement::SkipData
                    (pEVar3,inDataStream,
                     *(EbmlSemanticContext **)(CONCAT44(extraout_var_01,iVar10) + 0x18),
                     (EbmlElement *)0x0,false);
          if (bVar12 == 0 && local_60 != (EbmlElement *)0x0) goto LAB_001922c1;
          goto LAB_001922c7;
        }
      }
      else {
        if (local_60->bSizeIsFinite == true) goto LAB_00192294;
        (*local_60->_vptr_EbmlElement[1])(local_60);
      }
      iVar10 = *UpperEltFound;
      if (((iVar10 == 0) || (*UpperEltFound = iVar10 + -1, 1 < iVar10)) || (uVar13 == 0))
      goto LAB_0019237c;
      local_60 = *local_50;
      break;
    }
    if (local_60->bSizeIsFinite != true) {
      (*local_60->_vptr_EbmlElement[1])(local_60);
      break;
    }
    EbmlElement::SkipData(local_60,inDataStream,local_40,(EbmlElement *)0x0,false);
    if (local_60 != (EbmlElement *)0x0) {
LAB_001922c1:
      (*local_60->_vptr_EbmlElement[1])();
    }
LAB_001922c7:
    iVar10 = *UpperEltFound;
    if (iVar10 < 1) {
      if (((iVar10 < 0) && (*UpperEltFound = iVar10 + 1, iVar10 != -1)) || (uVar13 == 0))
      goto LAB_0019237c;
      local_60 = EbmlStream::FindNextElement
                           (inDataStream,local_40,UpperEltFound,uVar13,SUB41(local_58,0),1);
    }
    else {
      *UpperEltFound = iVar10 + -1;
      if ((iVar10 != 1) || (uVar13 == 0)) goto LAB_0019237c;
      local_60 = *local_50;
    }
  }
  if (0 < *UpperEltFound) {
LAB_00192374:
    *local_50 = local_60;
  }
LAB_0019237c:
  __position._M_current =
       (local_48->
       super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->ElementList).
        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((this->bChecksumUsed & 1U) != 0) {
        __position._M_current = (EbmlElement **)0x0;
LAB_001923f7:
        if (*__position._M_current != (EbmlElement *)0x0) {
          (*(*__position._M_current)->_vptr_EbmlElement[1])();
        }
        std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::erase
                  (local_48,__position);
      }
      (this->super_EbmlElement).bValueIsSet = true;
      return;
    }
    iVar10 = (*(*__position._M_current)->_vptr_EbmlElement[3])();
    if ((*(long *)(EbmlCrc32::ClassInfos._8_8_ + 8) ==
         *(long *)((int *)CONCAT44(extraout_var_02,iVar10) + 2)) &&
       (*(int *)EbmlCrc32::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_02,iVar10))) {
      this->bChecksumUsed = true;
      pEVar3 = *__position._M_current;
      uVar11 = pEVar3->Size;
      uVar4 = *(undefined4 *)((long)&pEVar3->Size + 4);
      uVar7 = pEVar3->DefaultSize;
      uVar5 = *(undefined4 *)((long)&pEVar3->DefaultSize + 4);
      iVar10 = pEVar3->SizeLength;
      bVar8 = pEVar3->bSizeIsFinite;
      uVar9 = *(undefined3 *)&pEVar3->field_0x1d;
      uVar13 = pEVar3->ElementPosition;
      uVar6 = *(undefined8 *)((long)&pEVar3->SizePosition + 3);
      *(undefined8 *)
       ((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.ElementPosition + 3) =
           *(undefined8 *)((long)&pEVar3->ElementPosition + 3);
      *(undefined8 *)((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.SizePosition + 3) =
           uVar6;
      (this->Checksum).super_EbmlBinary.super_EbmlElement.SizeLength = iVar10;
      (this->Checksum).super_EbmlBinary.super_EbmlElement.bSizeIsFinite = bVar8;
      *(undefined3 *)&(this->Checksum).super_EbmlBinary.super_EbmlElement.field_0x1d = uVar9;
      (this->Checksum).super_EbmlBinary.super_EbmlElement.ElementPosition = uVar13;
      *(int *)&(this->Checksum).super_EbmlBinary.super_EbmlElement.Size = (int)uVar11;
      *(undefined4 *)((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.Size + 4) = uVar4;
      *(int *)&(this->Checksum).super_EbmlBinary.super_EbmlElement.DefaultSize = (int)uVar7;
      *(undefined4 *)((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.DefaultSize + 4) =
           uVar5;
      (this->Checksum).super_EbmlBinary.Data = (binary *)pEVar3[1]._vptr_EbmlElement;
      uVar4 = *(undefined4 *)((long)&pEVar3[1].Size + 4);
      (this->Checksum).m_crc = *(undefined4 *)&pEVar3[1].Size;
      (this->Checksum).m_crc_final = uVar4;
      goto LAB_001923f7;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void EbmlMaster::Read(EbmlStream & inDataStream, const EbmlSemanticContext & sContext, int & UpperEltFound, EbmlElement * & FoundElt, bool AllowDummyElt, ScopeMode ReadFully)
{
  if (ReadFully == SCOPE_NO_DATA)
    return;

  EbmlElement * ElementLevelA;
  // remove all existing elements, including the mandatory ones...
  size_t Index;
  for (Index=0; Index<ElementList.size(); Index++) {
    if (!(*ElementList[Index]).IsLocked()) {
      delete ElementList[Index];
    }
  }
  ElementList.clear();
  uint64 MaxSizeToRead;

  if (IsFiniteSize())
    MaxSizeToRead = GetSize();
  else
    MaxSizeToRead = 0x7FFFFFFF;

  // read blocks and discard the ones we don't care about
  if (MaxSizeToRead > 0)
  {
    inDataStream.I_O().setFilePointer(GetSizePosition() + GetSizeLength(), seek_beginning);
    ElementLevelA = inDataStream.FindNextElement(sContext, UpperEltFound, MaxSizeToRead, AllowDummyElt);
    while (ElementLevelA != NULL && UpperEltFound <= 0 && MaxSizeToRead > 0) {
      if (IsFiniteSize() && ElementLevelA->IsFiniteSize())
        MaxSizeToRead = GetEndPosition() - ElementLevelA->GetEndPosition(); // even if it's the default value
      if (!AllowDummyElt && ElementLevelA->IsDummy()) {
        if (ElementLevelA->IsFiniteSize()) {
          ElementLevelA->SkipData(inDataStream, sContext);
          delete ElementLevelA; // forget this unknown element
        } else {
          delete ElementLevelA; // forget this unknown element
          break;
        }
      } else {
        ElementLevelA->Read(inDataStream, EBML_CONTEXT(ElementLevelA), UpperEltFound, FoundElt, AllowDummyElt, ReadFully);

        // Discard elements that couldn't be read properly if
        // SCOPE_ALL_DATA has been requested. This can happen
        // e.g. if block data is defective.
        bool DeleteElement = true;

        if (ElementLevelA->ValueIsSet() || (ReadFully != SCOPE_ALL_DATA)) {
          ElementList.push_back(ElementLevelA);
          DeleteElement = false;
        }

        // just in case
        if (ElementLevelA->IsFiniteSize()) {
          ElementLevelA->SkipData(inDataStream, EBML_CONTEXT(ElementLevelA));
          if (DeleteElement)
            delete ElementLevelA;
        } else {
          if (DeleteElement)
            delete ElementLevelA;

          if (UpperEltFound) {
            --UpperEltFound;
            if (UpperEltFound > 0 || MaxSizeToRead <= 0)
              goto processCrc;
            ElementLevelA = FoundElt;
          }

          break;
        }
      }

      if (UpperEltFound > 0) {
        UpperEltFound--;
        if (UpperEltFound > 0 || MaxSizeToRead <= 0)
          goto processCrc;
        ElementLevelA = FoundElt;
        continue;
      }

      if (UpperEltFound < 0) {
        UpperEltFound++;
        if (UpperEltFound < 0)
          goto processCrc;
      }

      if (MaxSizeToRead <= 0)
        goto processCrc;// this level is finished

      ElementLevelA = inDataStream.FindNextElement(sContext, UpperEltFound, MaxSizeToRead, AllowDummyElt);
    }
    if (UpperEltFound > 0) {
      FoundElt = ElementLevelA;
    }
  }
processCrc:

  EBML_MASTER_ITERATOR Itr, CrcItr;
  for (Itr = ElementList.begin(); Itr != ElementList.end();) {
    if ((EbmlId)(*(*Itr)) == EBML_ID(EbmlCrc32)) {
      bChecksumUsed = true;
      // remove the element
      Checksum = *(static_cast<EbmlCrc32*>(*Itr));
      CrcItr = Itr;
      break;
    }
    ++Itr;
  }

  if (bChecksumUsed)
  {
    delete *CrcItr;
    Remove(CrcItr);
  }

  SetValueIsSet();
}